

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Mux_ManFree(Mux_Man_t *p)

{
  Mux_Man_t *p_local;
  
  Abc_NamStop(p->pNames);
  Vec_WecFree(p->vTops);
  if (p != (Mux_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Mux_ManFree( Mux_Man_t * p )
{
    Abc_NamStop( p->pNames );
    Vec_WecFree( p->vTops );
    ABC_FREE( p );
}